

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipc.c
# Opt level: O0

int nn_cipc_create(nn_ep *ep)

{
  nn_sipc *owner;
  nn_ep *in_RDI;
  nn_ep *unaff_retaddr;
  size_t sz;
  int reconnect_ivl_max;
  int reconnect_ivl;
  nn_cipc *self;
  nn_usock *in_stack_ffffffffffffffe0;
  long lVar1;
  nn_ep *ep_00;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  nn_sipc *self_00;
  
  owner = (nn_sipc *)nn_alloc_(0x305c63);
  if (owner == (nn_sipc *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/cipc.c"
            ,0x67);
    fflush(_stderr);
    nn_err_abort();
  }
  *(nn_ep **)&owner->usock = in_RDI;
  nn_ep_tran_setup(in_RDI,&nn_cipc_ep_ops,owner);
  self_00 = owner;
  nn_ep_getctx((nn_ep *)0x305cf6);
  nn_fsm_init_root(&self_00->fsm,
                   (nn_fsm_fn)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                   (nn_fsm_fn)in_stack_ffffffffffffffe0,(nn_ctx *)owner);
  self_00->state = 1;
  nn_usock_init(in_stack_ffffffffffffffe0,(int)((ulong)owner >> 0x20),(nn_fsm *)0x305d34);
  lVar1 = 4;
  nn_ep_getopt(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,self_00,
               (size_t *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (lVar1 != 4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (reconnect_ivl)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/cipc.c"
            ,0x72);
    fflush(_stderr);
    nn_err_abort();
  }
  ep_00 = (nn_ep *)0x4;
  nn_ep_getopt(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,self_00,
               (size_t *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (ep_00 != (nn_ep *)0x4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (reconnect_ivl_max)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/cipc.c"
            ,0x76);
    fflush(_stderr);
    nn_err_abort();
  }
  if (in_stack_ffffffffffffffe8 == 0) {
    in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffec;
  }
  nn_backoff_init((nn_backoff *)self_00,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,0,
                  &owner->fsm);
  nn_sipc_init(self_00,in_stack_ffffffffffffffec,ep_00,&owner->fsm);
  nn_fsm_start((nn_fsm *)0x305e96);
  return 0;
}

Assistant:

int nn_cipc_create (struct nn_ep *ep)
{
    struct nn_cipc *self;
    int reconnect_ivl;
    int reconnect_ivl_max;
    size_t sz;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_cipc), "cipc");
    alloc_assert (self);

    /*  Initialise the structure. */
    self->ep = ep;
    nn_ep_tran_setup (ep, &nn_cipc_ep_ops, self);
    nn_fsm_init_root (&self->fsm, nn_cipc_handler, nn_cipc_shutdown,
        nn_ep_getctx (ep));
    self->state = NN_CIPC_STATE_IDLE;
    nn_usock_init (&self->usock, NN_CIPC_SRC_USOCK, &self->fsm);
    sz = sizeof (reconnect_ivl);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_RECONNECT_IVL, &reconnect_ivl, &sz);
    nn_assert (sz == sizeof (reconnect_ivl));
    sz = sizeof (reconnect_ivl_max);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_RECONNECT_IVL_MAX,
        &reconnect_ivl_max, &sz);
    nn_assert (sz == sizeof (reconnect_ivl_max));
    if (reconnect_ivl_max == 0)
        reconnect_ivl_max = reconnect_ivl;
    nn_backoff_init (&self->retry, NN_CIPC_SRC_RECONNECT_TIMER,
        reconnect_ivl, reconnect_ivl_max, &self->fsm);
    nn_sipc_init (&self->sipc, NN_CIPC_SRC_SIPC, ep, &self->fsm);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    return 0;
}